

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

bool __thiscall QPDFObjectHandle::isOrHasName(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  bool bVar2;
  QPDFObjectHandle *item;
  pointer this_00;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_40;
  
  bVar1 = isNameAndEquals(this,value);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = isArray(this);
    if (bVar1) {
      getArrayAsVector(&local_40,this);
      for (this_00 = local_40.
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_start;
          this_00 !=
          local_40.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
          super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        bVar1 = isNameAndEquals(this_00,value);
        if (bVar1) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_40);
          if (this_00 !=
              local_40.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            return true;
          }
          goto LAB_001c4d56;
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_40);
    }
LAB_001c4d56:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
QPDFObjectHandle::isOrHasName(std::string const& value) const
{
    if (isNameAndEquals(value)) {
        return true;
    } else if (isArray()) {
        for (auto& item: getArrayAsVector()) {
            if (item.isNameAndEquals(value)) {
                return true;
            }
        }
    }
    return false;
}